

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCountOnesInCofsSimple(word *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int *pStore_local;
  int nVars_local;
  word *pTruth_local;
  
  Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
  iVar1 = Abc_TtCountOnesInTruth(pTruth,nVars);
  return iVar1;
}

Assistant:

int Abc_TtCountOnesInCofsSimple( word * pTruth, int nVars, int * pStore )
{
    Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
    return Abc_TtCountOnesInTruth( pTruth, nVars );
}